

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtwister.c
# Opt level: O0

void m_seedRand(MTRand *rand,unsigned_long seed)

{
  unsigned_long seed_local;
  MTRand *rand_local;
  
  rand->mt[0] = seed & 0xffffffff;
  rand->index = 1;
  while (rand->index < 0x270) {
    rand->mt[rand->index] = rand->mt[rand->index + -1] * 0x17b5 & 0xffffffff;
    rand->index = rand->index + 1;
  }
  return;
}

Assistant:

inline static void m_seedRand(MTRand* rand, unsigned long seed) {
  /* set initial seeds to mt[STATE_VECTOR_LENGTH] using the generator
   * from Line 25 of Table 1 in: Donald Knuth, "The Art of Computer
   * Programming," Vol. 2 (2nd Ed.) pp.102.
   */
  rand->mt[0] = seed & 0xffffffff;
  for(rand->index=1; rand->index<STATE_VECTOR_LENGTH; rand->index++) {
    rand->mt[rand->index] = (6069 * rand->mt[rand->index-1]) & 0xffffffff;
  }
}